

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParser.cpp
# Opt level: O0

PDFObjectParser * __thiscall
PDFParser::StartReadingObjectsFromStream(PDFParser *this,PDFStreamInput *inStream)

{
  IByteReader *inSourceStream;
  InputStreamSkipperStream *this_00;
  IReadPositionProvider *local_68;
  InputStreamSkipperStream *source;
  PDFObjectParser *objectsParser;
  IByteReader *readStream;
  PDFStreamInput *inStream_local;
  PDFParser *this_local;
  
  inSourceStream = StartReadingFromStream(this,inStream);
  if (inSourceStream == (IByteReader *)0x0) {
    this_local = (PDFParser *)0x0;
  }
  else {
    this_local = (PDFParser *)operator_new(0x60);
    PDFObjectParser::PDFObjectParser((PDFObjectParser *)this_local);
    this_00 = (InputStreamSkipperStream *)operator_new(0x20);
    InputStreamSkipperStream::InputStreamSkipperStream(this_00,inSourceStream);
    local_68 = (IReadPositionProvider *)0x0;
    if (this_00 != (InputStreamSkipperStream *)0x0) {
      local_68 = &this_00->super_IReadPositionProvider;
    }
    PDFObjectParser::SetReadStream
              ((PDFObjectParser *)this_local,(IByteReader *)this_00,local_68,true);
    PDFObjectParser::SetParserExtender((PDFObjectParser *)this_local,this->mParserExtender);
  }
  return (PDFObjectParser *)this_local;
}

Assistant:

PDFObjectParser* PDFParser::StartReadingObjectsFromStream(PDFStreamInput* inStream) {
	IByteReader* readStream = StartReadingFromStream(inStream);
	if(!readStream)
		return NULL;

	PDFObjectParser* objectsParser = new PDFObjectParser();
	InputStreamSkipperStream* source = new InputStreamSkipperStream(readStream);
	objectsParser->SetReadStream(source,source,true);
	// Not setting decryption filter cause shuoldnt decrypt at lower level. if at all - the stream is encrypted already
	objectsParser->SetParserExtender(mParserExtender);

	return objectsParser;
}